

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O1

void __thiscall EditDistance::updateDpMatrix(EditDistance *this,int upperBound)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int j;
  int i;
  
  if ((long)this->seqSize < 1) {
    iVar3 = 0;
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    iVar3 = 0;
    do {
      lVar1 = *(long *)((long)&this->seq1->var + lVar5);
      uVar6 = 0;
      if ((*(int *)(lVar1 + 0xc) < 1) && (-1 < *(int *)(lVar1 + 0x10))) {
        if (*(char **)(lVar1 + 0x28) == (char *)0x0) {
          uVar6 = 1;
        }
        else {
          uVar6 = (uint)(**(char **)(lVar1 + 0x28) != '\0');
        }
      }
      lVar1 = *(long *)((long)&this->seq2->var + lVar5);
      uVar7 = 0;
      if ((*(int *)(lVar1 + 0xc) < 1) && (-1 < *(int *)(lVar1 + 0x10))) {
        if (*(char **)(lVar1 + 0x28) == (char *)0x0) {
          uVar7 = 1;
        }
        else {
          uVar7 = (uint)(**(char **)(lVar1 + 0x28) != '\0');
        }
      }
      iVar3 = iVar3 + uVar7;
      iVar4 = iVar4 + uVar6;
      lVar5 = lVar5 + 0x10;
    } while ((long)this->seqSize * 0x10 != lVar5);
  }
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  iVar4 = this->seqSize;
  if (-1 < iVar4) {
    iVar3 = upperBound / this->min_id_cost + iVar3;
    i = 0;
    do {
      j = i - iVar3;
      if (i - iVar3 < 1) {
        j = 0;
      }
      if (i + iVar3 < iVar4) {
        iVar4 = i + iVar3;
      }
      if (j <= iVar4) {
        do {
          updateDpPosition(this,i,j,iVar3);
          bVar2 = j < iVar4;
          j = j + 1;
        } while (bVar2);
      }
      iVar4 = this->seqSize;
      bVar2 = i < iVar4;
      i = i + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void updateDpMatrix(int upperBound) {
		//
		// First update regular matrix
		//

		// count num possible 0 insertions
		int possible_0_inserts = 0;
		int possible_0_deletes = 0;
		for (int i = 0; i < seqSize; i++) {
			if (seq1[i].indomain(0)) {
				possible_0_inserts++;
			}
			if (seq2[i].indomain(0)) {
				possible_0_deletes++;
			}
		}

		// d = distance to diagonal that should be calculated in the matrix
		const int d = upperBound / min_id_cost + std::max(possible_0_inserts, possible_0_deletes);

#ifndef NDEBUG
		std::cout << "d = " << d << '\n';
#endif

		for (int i = 0; i < seqSize + 1; i++) {
			const int startCol = std::max(0, i - d);
			const int endCol = std::min(seqSize, i + d);
			for (int j = startCol; j < endCol + 1; j++) {
				updateDpPosition(i, j, d);
			}
		}
	}